

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O0

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)

{
  stb__leakcheck_malloc_info *local_18;
  stb__leakcheck_malloc_info *mi;
  sx_dump_leak_cb dump_leak_fn_local;
  
  for (local_18 = mi_head; local_18 != (stb__leakcheck_malloc_info *)0x0; local_18 = local_18->next)
  {
    if (-1 < (long)local_18->size) {
      stblkck_internal_print
                (dump_leak_fn,"LEAKED",local_18->file,local_18->func,local_18->line,local_18->size,
                 local_18 + 1);
    }
  }
  return;
}

Assistant:

void sx_dump_leaks(sx_dump_leak_cb dump_leak_fn)
{
    stb__leakcheck_malloc_info* mi = mi_head;
    while (mi) {
        if ((ptrdiff_t)mi->size >= 0) {
            stblkck_internal_print(dump_leak_fn, "LEAKED", mi->file, mi->func, mi->line, mi->size, mi + 1);
        }
        mi = mi->next;
    }
}